

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebsockets.c
# Opt level: O1

int lws_check_byte_utf8(uchar state,uchar c)

{
  uint uVar1;
  ulong uVar2;
  uchar s;
  undefined7 in_register_00000039;
  
  if ((int)CONCAT71(in_register_00000039,state) == 0) {
    if (-1 < (char)c) {
      return 0;
    }
    if ((byte)(c + 0xb) < 0xcd) {
      return -1;
    }
    if (c < 0xe0) {
      return 0x8c;
    }
    uVar2 = (ulong)(c & 0x1f);
  }
  else {
    uVar1 = (uint)state;
    if (((uint)c < (uVar1 & 0xf0)) || ((uVar1 & 0xf0) + (uVar1 & 0xc) * 4 + 0x10 <= (uint)c)) {
      return -1;
    }
    uVar2 = (ulong)((uVar1 & 3) + 0x15);
  }
  return (int)e0f4[uVar2];
}

Assistant:

int
lws_check_byte_utf8(unsigned char state, unsigned char c)
{
	unsigned char s = state;

	if (!s) {
		if (c >= 0x80) {
			if (c < 0xc2 || c > 0xf4)
				return -1;
			if (c < 0xe0)
				return 0x80 | ((4 - 1) << 2);
			else
				return e0f4[c - 0xe0];
		}

		return s;
	}
	if (c < (s & 0xf0) || c >= (s & 0xf0) + 0x10 + ((s << 2) & 0x30))
		return -1;

	return e0f4[21 + (s & 3)];
}